

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls12_client.c
# Opt level: O2

int mbedtls_ssl_handshake_client_step(mbedtls_ssl_context *ssl)

{
  byte bVar1;
  mbedtls_ssl_protocol_version mVar2;
  mbedtls_ssl_protocol_version mVar3;
  mbedtls_ecp_group_id grp_id;
  mbedtls_ssl_handshake_params *pmVar4;
  mbedtls_x509_crt *pmVar5;
  uchar *puVar6;
  mbedtls_ssl_session *pmVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uchar uVar11;
  uint16_t uVar12;
  ushort uVar13;
  ushort uVar14;
  int iVar15;
  mbedtls_ssl_protocol_version mVar16;
  uint uVar17;
  mbedtls_pk_type_t type;
  mbedtls_md_type_t md_alg;
  mbedtls_ssl_key_cert *pmVar18;
  mbedtls_pk_context *pmVar19;
  uchar *puVar20;
  mbedtls_ssl_ciphersuite_t *pmVar21;
  int *piVar22;
  int iVar23;
  uchar *puVar24;
  ulong uVar25;
  uint16_t *puVar26;
  ulong uVar27;
  char *pcVar28;
  uint8_t uVar29;
  long lVar30;
  size_t sVar31;
  ulong uVar32;
  int iVar33;
  ushort *puVar34;
  ushort *puVar35;
  ulong uVar36;
  bool bVar37;
  undefined8 in_stack_fffffffffffffe38;
  undefined4 uVar38;
  undefined8 in_stack_fffffffffffffe40;
  undefined4 uVar39;
  size_t local_1a8;
  uchar hash [48];
  size_t local_a8;
  size_t asn1_len;
  ushort uStack_98;
  size_t n;
  uchar *local_88;
  int iStack_80;
  undefined4 uStack_7c;
  size_t local_78;
  uchar *puStack_70;
  mbedtls_asn1_named_data *local_68;
  uchar uStack_60;
  undefined7 uStack_5f;
  uchar *local_58;
  ushort *local_50;
  ushort *local_48;
  size_t hashlen;
  uchar *local_38;
  
  uVar39 = (undefined4)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  switch(ssl->state) {
  case 0:
    ssl->state = 1;
    return 0;
  case 1:
    iVar15 = mbedtls_ssl_write_client_hello(ssl);
    return iVar15;
  case 2:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x4a9,"=> parse server hello");
    iVar15 = mbedtls_ssl_read_record(ssl,1);
    if (iVar15 != 0) {
      pcVar28 = "mbedtls_ssl_read_record";
      iVar23 = 0x4ad;
      goto LAB_001d2789;
    }
    if (ssl->in_msgtype != 0x16) {
      pcVar28 = "bad server hello message";
      iVar15 = 0x4c7;
      goto LAB_001d1b24;
    }
    puVar24 = ssl->in_msg;
    if (ssl->conf->transport == '\x01') {
      if (*puVar24 == '\x03') {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,0x4d2,"received hello verify request");
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,0x4d3,"<= parse server hello");
        puVar24 = ssl->in_msg;
        uVar29 = ssl->conf->transport;
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,0x450,"=> parse hello verify request");
        if ((ulong)(ssl->conf->transport == '\x01') * 8 + 7 <= ssl->in_msglen) {
          bVar37 = uVar29 == '\x01';
          mbedtls_debug_print_buf
                    (ssl,3,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0x464,"server version",puVar24 + (ulong)bVar37 * 8 + 4,2);
          if ((*(ushort *)(puVar24 + (ulong)bVar37 * 8 + 4) & 0xfdff) == 0xfdfe) {
            bVar1 = puVar24[(ulong)bVar37 * 8 + 6];
            puVar24 = puVar24 + (ulong)bVar37 * 8 + 7;
            uVar36 = (ulong)bVar1;
            if ((long)uVar36 <= (long)(ssl->in_msg + (ssl->in_msglen - (long)puVar24))) {
              mbedtls_debug_print_buf
                        (ssl,3,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                         ,0x47e,"cookie",puVar24,uVar36);
              free(ssl->handshake->cookie);
              puVar20 = (uchar *)calloc(1,uVar36);
              pmVar4 = ssl->handshake;
              pmVar4->cookie = puVar20;
              if (puVar20 == (uchar *)0x0) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                           ,0x484,"alloc failed (%d bytes)",uVar36);
                return -0x7f00;
              }
              memcpy(puVar20,puVar24,uVar36);
              pmVar4->cookie_len = bVar1;
              ssl->state = 1;
              iVar15 = mbedtls_ssl_reset_checksum(ssl);
              if (iVar15 == 0) {
                mbedtls_ssl_recv_flight_completed(ssl);
                pcVar28 = "<= parse hello verify request";
                iVar33 = 0;
                iVar15 = 2;
                iVar23 = 0x495;
                break;
              }
              pcVar28 = "mbedtls_ssl_reset_checksum";
              iVar23 = 0x48f;
              goto LAB_001d2789;
            }
            pcVar28 = "cookie length does not match incoming message size";
            iVar15 = 0x479;
            goto LAB_001d1e3b;
          }
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0x46e,"bad server version");
          goto LAB_001d2529;
        }
        pcVar28 = "incoming HelloVerifyRequest message is too short";
        iVar15 = 0x458;
        goto LAB_001d1e3b;
      }
      free(ssl->handshake->cookie);
      pmVar4 = ssl->handshake;
      pmVar4->cookie = (uchar *)0x0;
      pmVar4->cookie_len = '\0';
      lVar30 = (ulong)(ssl->conf->transport == '\x01') * 8 + 4;
    }
    else {
      lVar30 = 4;
    }
    if ((lVar30 + 0x26U <= ssl->in_hslen) && (*puVar24 == '\x02')) {
      puVar24 = puVar24 + lVar30;
      uVar38 = 0;
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0x4f3,"server hello, version",puVar24,2);
      uVar12 = mbedtls_ssl_read_version(puVar24,(uint)ssl->conf->transport);
      ssl->tls_version = (uint)uVar12;
      ssl->session_negotiate->tls_version = (uint)uVar12;
      mVar2 = ssl->conf->max_tls_version;
      mVar3 = ssl->conf->min_tls_version;
      mVar16 = (mbedtls_ssl_protocol_version)uVar12;
      if (mVar2 < mVar16 || mVar16 < mVar3) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,0x4ff,"server version out of bounds -  min: [0x%x], server: [0x%x], max: [0x%x]"
                   ,(ulong)mVar3,CONCAT44(uVar38,mVar16),CONCAT44(uVar39,mVar2));
LAB_001d2529:
        mbedtls_ssl_send_alert_message(ssl,'\x02','F');
        return -0x6e80;
      }
      uVar17 = *(uint *)(puVar24 + 2);
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0x50b,"server hello, current time: %lu",
                 (ulong)(uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                        uVar17 << 0x18));
      pmVar4 = ssl->handshake;
      uVar8 = *(undefined8 *)(puVar24 + 2);
      uVar9 = *(undefined8 *)(puVar24 + 10);
      uVar10 = *(undefined8 *)(puVar24 + 0x1a);
      *(undefined8 *)(pmVar4->randbytes + 0x30) = *(undefined8 *)(puVar24 + 0x12);
      *(undefined8 *)(pmVar4->randbytes + 0x38) = uVar10;
      *(undefined8 *)(pmVar4->randbytes + 0x20) = uVar8;
      *(undefined8 *)(pmVar4->randbytes + 0x28) = uVar9;
      puVar20 = (uchar *)(ulong)puVar24[0x22];
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0x511,"server hello, random bytes",puVar24 + 2,0x20);
      if ((uchar *)0x20 < puVar20) {
        pcVar28 = "bad server hello message";
        iVar15 = 0x514;
        goto LAB_001d1e3b;
      }
      puVar6 = (uchar *)ssl->in_hslen;
      uVar36 = (ulong)(ssl->conf->transport == '\x01');
      lVar30 = uVar36 * 8;
      if (puVar20 + uVar36 * 8 + 0x2b < puVar6) {
        puVar34 = (ushort *)
                  (ulong)(ushort)(*(ushort *)(puVar24 + 0x26 + (long)puVar20) << 8 |
                                 *(ushort *)(puVar24 + 0x26 + (long)puVar20) >> 8);
        if (((char *)((long)puVar34 - 1U) < (char *)0x3) ||
           (puVar6 != puVar20 + lVar30 + 4 + (long)puVar34 + 0x28)) {
          pcVar28 = "bad server hello message";
          iVar15 = 0x520;
          goto LAB_001d1e3b;
        }
      }
      else {
        if (puVar6 != puVar20 + lVar30 + 0x2a) {
          pcVar28 = "bad server hello message";
          iVar15 = 0x52a;
          goto LAB_001d1e3b;
        }
        puVar34 = (ushort *)0x0;
      }
      if ((puVar24 + 0x25)[(long)puVar20] != '\0') {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,0x53a,"server hello, bad compression: %d");
        mbedtls_ssl_send_alert_message(ssl,'\x02','/');
        return -0x7080;
      }
      uVar17 = (uint)(ushort)(*(ushort *)(puVar24 + 0x23 + (long)puVar20) << 8 |
                             *(ushort *)(puVar24 + 0x23 + (long)puVar20) >> 8);
      hashlen = CONCAT44(hashlen._4_4_,uVar17);
      local_50 = puVar34;
      local_38 = puVar20;
      pmVar21 = mbedtls_ssl_ciphersuite_from_id(uVar17);
      ssl->handshake->ciphersuite_info = pmVar21;
      if (pmVar21 == (mbedtls_ssl_ciphersuite_t *)0x0) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,0x548,"ciphersuite info for %04x not found",hashlen & 0xffffffff);
        mbedtls_ssl_send_alert_message(ssl,'\x02','P');
        return -0x7100;
      }
      mbedtls_ssl_optimize_checksum(ssl,pmVar21);
      puVar20 = local_38;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0x550,"server hello, session id len.: %zu",local_38);
      local_58 = puVar24 + 0x23;
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0x551,"server hello, session id",local_58,(size_t)puVar20);
      pmVar7 = ssl->session_negotiate;
      pmVar4 = ssl->handshake;
      uVar29 = pmVar4->resume;
      if ((((uVar29 == '\0') || ((char)local_38 == '\0')) || (pmVar7->ciphersuite != (int)hashlen))
         || (((uchar *)pmVar7->id_len != local_38 ||
             (iVar15 = bcmp(pmVar7->id,local_58,(size_t)local_38), iVar15 != 0)))) {
        ssl->state = ssl->state + 1;
        pmVar4->resume = '\0';
        pmVar7->ciphersuite = (int)hashlen;
        pmVar7->id_len = (size_t)local_38;
        memcpy(pmVar7->id,local_58,(size_t)local_38);
        uVar29 = ssl->handshake->resume;
      }
      else {
        ssl->state = 0xc;
      }
      pcVar28 = "a";
      if (uVar29 == '\0') {
        pcVar28 = "no";
      }
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0x56a,"%s session has been resumed",pcVar28);
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0x56c,"server hello, chosen ciphersuite: %04x",hashlen & 0xffffffff);
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0x56e,"server hello, compress alg.: %d",(ulong)(puVar24 + 0x25)[(long)local_38]);
      piVar22 = ssl->conf->ciphersuite_list;
      do {
        iVar15 = *piVar22;
        if (iVar15 == 0) {
          pcVar28 = "bad server hello message";
          iVar15 = 0x576;
          goto LAB_001d28b6;
        }
        piVar22 = piVar22 + 1;
      } while (iVar15 != ssl->session_negotiate->ciphersuite);
      pmVar21 = mbedtls_ssl_ciphersuite_from_id(iVar15);
      iVar15 = mbedtls_ssl_validate_ciphersuite(ssl,pmVar21,ssl->tls_version,ssl->tls_version);
      if (iVar15 == 0) {
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,0x591,"server hello, chosen ciphersuite: %s",pmVar21->name);
        puVar34 = (ushort *)(puVar24 + (long)local_38 + 0x28);
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,0x5a7,"server hello, total extension length: %zu",local_50);
        while (local_50 != (ushort *)0x0) {
          uVar13 = puVar34[1] << 8 | puVar34[1] >> 8;
          puVar35 = (ushort *)(ulong)(uVar13 + 4);
          bVar37 = local_50 < puVar35;
          local_50 = (ushort *)((long)local_50 - (long)puVar35);
          if (bVar37) {
            pcVar28 = "bad server hello message";
            iVar15 = 0x5b0;
            goto LAB_001d1e3b;
          }
          uVar14 = *puVar34 << 8 | *puVar34 >> 8;
          uVar36 = (ulong)uVar14;
          iVar15 = 3;
          if (uVar14 == 1) {
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                       ,0x5c8,"found max_fragment_length extension");
            if (((uVar13 != 1) || (uVar29 = ssl->conf->mfl_code, uVar29 == '\0')) ||
               ((uint8_t)puVar34[2] != uVar29)) {
              pcVar28 = "non-matching max fragment length extension";
              iVar15 = 0x29d;
              goto LAB_001d28b6;
            }
          }
          else if (uVar14 == 0xb) {
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                       ,0x609,"found supported_point_formats extension");
            if ((uVar13 == 0) || ((ushort)((byte)puVar34[2] + 1) != uVar13)) {
              pcVar28 = "bad server hello message";
              iVar15 = 0x335;
              goto LAB_001d1e3b;
            }
            uVar36 = 0;
            do {
              uVar25 = uVar36;
              if ((byte)puVar34[2] == uVar25) {
                pcVar28 = "no point format in common";
                iVar15 = 0x351;
                goto LAB_001d3058;
              }
              bVar1 = *(byte *)((long)puVar34 + uVar25 + 5);
              uVar36 = uVar25 + 1;
            } while (1 < bVar1);
            pmVar4 = ssl->handshake;
            (pmVar4->ecdh_ctx).point_format = bVar1;
            mbedtls_ecjpake_set_point_format
                      (&pmVar4->ecjpake_ctx,(uint)*(byte *)((long)puVar34 + uVar25 + 5));
            uVar36 = (ulong)*(byte *)((long)puVar34 + uVar25 + 5);
            iVar15 = 4;
            iVar23 = 0x349;
            pcVar28 = "point format selected: %d";
LAB_001d2fc3:
            mbedtls_debug_print_msg
                      (ssl,iVar15,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                       ,iVar23,pcVar28,uVar36);
          }
          else if (uVar14 == 0x100) {
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                       ,0x617,"found ecjpake_kkpp extension");
            if (ssl->handshake->ciphersuite_info->key_exchange == '\v') {
              local_38 = (uchar *)(ulong)uVar13;
              free(ssl->handshake->ecjpake_cache);
              pmVar4 = ssl->handshake;
              pmVar4->ecjpake_cache = (uchar *)0x0;
              pmVar4->ecjpake_cache_len = 0;
              iVar15 = mbedtls_ecjpake_read_round_one
                                 (&pmVar4->ecjpake_ctx,(uchar *)(puVar34 + 2),(size_t)local_38);
              if (iVar15 != 0) {
                mbedtls_debug_print_ret
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                           ,0x380,"mbedtls_ecjpake_read_round_one",iVar15);
                uVar11 = '(';
                goto LAB_001d30e7;
              }
            }
            else {
              mbedtls_debug_print_msg
                        (ssl,3,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                         ,0x364,"skip ecjpake kkpp extension");
            }
          }
          else {
            if (uVar14 != 0xff01) {
              iVar23 = 0x639;
              pcVar28 = "unknown extension found: %u (ignoring)";
              goto LAB_001d2fc3;
            }
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                       ,0x5b9,"found renegotiation extension");
            if ((uVar13 != 1) || ((char)puVar34[2] != '\0')) {
              pcVar28 = "non-zero length renegotiation info";
              iVar15 = 0x281;
              goto LAB_001d3058;
            }
            ssl->secure_renegotiation = 1;
          }
          puVar34 = (ushort *)((long)puVar34 + (long)puVar35);
          if ((char *)((long)local_50 + -1) < (char *)0x3) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                       ,0x640,"bad server hello message");
            return -0x7300;
          }
        }
        if ((ssl->handshake->resume != '\0') && (iVar15 = mbedtls_ssl_derive_keys(ssl), iVar15 != 0)
           ) {
          mbedtls_debug_print_ret
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0x64c,"mbedtls_ssl_derive_keys",iVar15);
          uVar11 = 'P';
LAB_001d30e7:
          mbedtls_ssl_send_alert_message(ssl,'\x02',uVar11);
          return iVar15;
        }
        if ((ssl->secure_renegotiation != 0) || (ssl->conf->allow_legacy_renegotiation != '\x02')) {
          pcVar28 = "<= parse server hello";
          iVar33 = 0;
          iVar15 = 2;
          iVar23 = 0x67d;
          break;
        }
        pcVar28 = "legacy renegotiation, breaking off handshake";
        iVar15 = 0x65c;
      }
      else {
        pcVar28 = "bad server hello message";
        iVar15 = 0x588;
      }
LAB_001d3058:
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,iVar15,pcVar28);
      goto LAB_001d24f0;
    }
    pcVar28 = "bad server hello message";
    iVar15 = 0x4e0;
    goto LAB_001d1e3b;
  case 3:
    iVar15 = mbedtls_ssl_parse_certificate(ssl);
    return iVar15;
  case 4:
    pmVar21 = ssl->handshake->ciphersuite_info;
    _uStack_98 = (ushort *)0x0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x82a,"=> parse server key exchange");
    iVar15 = mbedtls_ssl_read_record(ssl,1);
    if (iVar15 != 0) {
      pcVar28 = "mbedtls_ssl_read_record";
      iVar23 = 0x854;
      goto LAB_001d2789;
    }
    if (ssl->in_msgtype != 0x16) {
      pcVar28 = "bad server key exchange message";
      iVar15 = 0x859;
LAB_001d1b24:
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,iVar15,pcVar28);
      mbedtls_ssl_send_alert_message(ssl,'\x02','\n');
      return -0x7700;
    }
    puVar24 = ssl->in_msg;
    if (*puVar24 == '\f') {
      uVar36 = (ulong)(ssl->conf->transport == '\x01');
      puVar35 = (ushort *)(puVar24 + uVar36 * 8 + 4);
      puVar34 = (ushort *)(puVar24 + ssl->in_hslen);
      sVar31 = ssl->in_hslen - (uVar36 * 8 + 4);
      _uStack_98 = puVar35;
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0x881,"server key exchange",(uchar *)puVar35,sVar31);
      bVar1 = pmVar21->key_exchange;
      if ((byte)(bVar1 - 5) < 4) {
        iVar15 = 0x75b;
        if (1 < (long)sVar31) {
          uVar25 = (ulong)(ushort)(*puVar35 << 8 | *puVar35 >> 8);
          iVar15 = 0x763;
          if ((long)uVar25 <= (long)puVar34 - (long)(puVar24 + uVar36 * 8 + 6)) {
            puVar35 = (ushort *)(puVar24 + uVar36 * 8 + 6 + uVar25);
            _uStack_98 = puVar35;
            goto LAB_001d2357;
          }
        }
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,iVar15,"bad server key exchange message (psk_identity_hint length)");
        pcVar28 = "bad server key exchange message";
        iVar15 = 0x889;
        goto LAB_001d1e3b;
      }
LAB_001d2357:
      if (0xb < bVar1) {
LAB_001d26a8:
        iVar15 = 0x8f2;
LAB_001d1f2b:
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,iVar15,"should never happen");
        return -0x6c00;
      }
      if ((0x118U >> (bVar1 & 0x1f) & 1) != 0) {
        iVar15 = mbedtls_ecdh_read_params
                           (&ssl->handshake->ecdh_ctx,(uchar **)&stack0xffffffffffffff68,
                            (uchar *)puVar34);
        if (iVar15 == 0) {
          grp_id = (ssl->handshake->ecdh_ctx).grp_id;
          uVar12 = mbedtls_ssl_get_tls_id_from_ecp_group_id(grp_id);
          if (uVar12 == 0) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                       ,0x70a,"should never happen");
          }
          else {
            pcVar28 = mbedtls_ssl_get_curve_name_from_tls_id(uVar12);
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                       ,0x70f,"ECDH curve: %s",pcVar28);
            iVar15 = mbedtls_ssl_check_curve(ssl,grp_id);
            if (iVar15 == 0) {
              mbedtls_debug_printf_ecdh
                        (ssl,3,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                         ,0x716,&ssl->handshake->ecdh_ctx,MBEDTLS_DEBUG_ECDH_QP);
              goto LAB_001d237c;
            }
          }
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0x740,"bad server key exchange message (ECDHE curve)");
        }
        else {
          mbedtls_debug_print_ret
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0x735,"mbedtls_ecdh_read_params",iVar15);
        }
        pcVar28 = "bad server key exchange message";
        iVar15 = 0x8b1;
        goto LAB_001d28b6;
      }
      if ((0xa0U >> (bVar1 & 0x1f) & 1) == 0) {
        if (bVar1 != 0xb) goto LAB_001d26a8;
        iVar15 = mbedtls_ecjpake_read_round_two
                           (&ssl->handshake->ecjpake_ctx,(uchar *)puVar35,
                            (long)puVar34 - (long)puVar35);
        if (iVar15 != 0) {
          mbedtls_debug_print_ret
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0x8e7,"mbedtls_ecjpake_read_round_two",iVar15);
LAB_001d24f0:
          mbedtls_ssl_send_alert_message(ssl,'\x02','(');
          return -0x6e00;
        }
      }
LAB_001d237c:
      if (0xfc < (byte)(pmVar21->key_exchange - 5)) {
        pmVar5 = ssl->session_negotiate->peer_cert;
        if (pmVar5 == (mbedtls_x509_crt *)0x0) {
          iVar15 = 0x909;
          goto LAB_001d1f2b;
        }
        if (puVar34 < _uStack_98 || (ulong)((long)puVar34 - (long)_uStack_98) < 2) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0x912,"missing input data in %s","ssl_parse_server_key_exchange");
          mbedtls_ssl_pend_fatal_alert(ssl,'2',-0x7300);
          return -0x7300;
        }
        local_58 = (uchar *)CONCAT71(local_58._1_7_,ssl->conf->transport == '\x01');
        asn1_len = (size_t)ssl->in_msg;
        local_50 = _uStack_98;
        uVar13 = *_uStack_98;
        uVar11 = (uchar)(uVar13 >> 8);
        hashlen = (size_t)pmVar5;
        type = mbedtls_ssl_pk_alg_from_sig(uVar11);
        md_alg = mbedtls_ssl_md_alg_from_hash((uchar)uVar13);
        local_38 = (uchar *)CONCAT44(local_38._4_4_,type);
        if (type == MBEDTLS_PK_NONE || md_alg == MBEDTLS_MD_NONE) {
          pmVar4 = ssl->handshake;
          if ((((pmVar4 == (mbedtls_ssl_handshake_params *)0x0) ||
               (pmVar4->sig_algs_heap_allocated != '\x01')) ||
              (puVar26 = pmVar4->sig_algs, puVar26 == (uint16_t *)0x0)) &&
             (puVar26 = ssl->conf->sig_algs, puVar26 == (uint16_t *)0x0)) {
LAB_001d2b67:
            if ((ssl->tls_version != MBEDTLS_SSL_VERSION_TLS1_2) ||
               (uVar11 != '\x03' || (byte)((uchar)uVar13 - 5) < 0xfe)) {
              pcVar28 = "bad server key exchange message";
              iVar15 = 0x919;
              goto LAB_001d28b6;
            }
          }
          else {
            do {
              uVar12 = *puVar26;
              if (uVar12 == 0) goto LAB_001d2b67;
              puVar26 = puVar26 + 1;
            } while (uVar12 != (uint16_t)(uVar13 << 8 | uVar13 >> 8));
          }
        }
        pmVar19 = (mbedtls_pk_context *)(hashlen + 0x168);
        _uStack_98 = _uStack_98 + 1;
        iVar15 = mbedtls_pk_can_do(pmVar19,type);
        if (iVar15 == 0) {
          pcVar28 = "bad server key exchange message";
          iVar15 = 0x924;
LAB_001d28b6:
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,iVar15,pcVar28);
          mbedtls_ssl_send_alert_message(ssl,'\x02','/');
          return -0x6600;
        }
        if (puVar34 + -1 < _uStack_98) {
          pcVar28 = "bad server key exchange message";
          iVar15 = 0x931;
LAB_001d1e3b:
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,iVar15,pcVar28);
          mbedtls_ssl_send_alert_message(ssl,'\x02','2');
          return -0x7300;
        }
        uVar36 = (ulong)(ushort)(*_uStack_98 << 8 | *_uStack_98 >> 8);
        _uStack_98 = _uStack_98 + 1;
        if (_uStack_98 != (ushort *)((long)puVar34 - uVar36)) {
          pcVar28 = "bad server key exchange message";
          iVar15 = 0x93c;
          goto LAB_001d1e3b;
        }
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,0x944,"signature",(uchar *)_uStack_98,uVar36);
        if (md_alg == MBEDTLS_MD_NONE) {
          iVar15 = 0x951;
          goto LAB_001d1f2b;
        }
        puVar24 = (uchar *)(asn1_len + ((ulong)local_58 & 0xff) * 8 + 4);
        iVar15 = mbedtls_ssl_get_key_exchange_md_tls1_2
                           (ssl,(uchar *)&local_1a8,(size_t *)&local_48,puVar24,
                            (long)local_50 - (long)puVar24,md_alg);
        if (iVar15 != 0) {
          return iVar15;
        }
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,0x955,"parameters hash",(uchar *)&local_1a8,(size_t)local_48);
        iVar15 = mbedtls_pk_can_do(pmVar19,(mbedtls_pk_type_t)local_38);
        if (iVar15 == 0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0x95b,"bad server key exchange message");
          mbedtls_ssl_send_alert_message(ssl,'\x02','(');
          return -0x6d00;
        }
        iVar15 = mbedtls_pk_verify_restartable
                           (pmVar19,md_alg,(uchar *)&local_1a8,(size_t)local_48,(uchar *)_uStack_98,
                            uVar36,(mbedtls_pk_restart_ctx *)0x0);
        if (iVar15 != 0) {
          mbedtls_ssl_send_alert_message(ssl,'\x02','3');
          pcVar28 = "mbedtls_pk_verify";
          iVar23 = 0x987;
LAB_001d2789:
          mbedtls_debug_print_ret
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,iVar23,pcVar28,iVar15);
          return iVar15;
        }
      }
    }
    else {
      if ((pmVar21->key_exchange | 2) != 7) {
        pcVar28 = "server key exchange message must not be skipped";
        iVar15 = 0x86f;
        goto LAB_001d1b24;
      }
      ssl->keep_current_message = 1;
    }
    ssl->state = ssl->state + 1;
    pcVar28 = "<= parse server key exchange";
    iVar33 = 0;
    iVar15 = 2;
    iVar23 = 0x99c;
    break;
  case 5:
    pmVar21 = ssl->handshake->ciphersuite_info;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x9c3,"=> parse certificate request");
    uVar17 = (uint)pmVar21->key_exchange;
    if ((10 < uVar17) || ((0x61eU >> (uVar17 & 0x1f) & 1) == 0)) {
      pcVar28 = "<= skip parse certificate request";
      iVar15 = 0x9c6;
      goto LAB_001d1cec;
    }
    iVar15 = mbedtls_ssl_read_record(ssl,1);
    if (iVar15 != 0) {
      pcVar28 = "mbedtls_ssl_read_record";
      iVar23 = 0x9cc;
      goto LAB_001d2789;
    }
    if (ssl->in_msgtype != 0x16) {
      pcVar28 = "bad certificate request message";
      iVar15 = 0x9d1;
      goto LAB_001d1b24;
    }
    ssl->state = ssl->state + 1;
    bVar37 = *ssl->in_msg == '\r';
    ssl->handshake->client_auth = bVar37;
    pcVar28 = "no";
    if (bVar37) {
      pcVar28 = "a";
    }
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x9de,"got %s certificate request",pcVar28);
    if (ssl->handshake->client_auth == '\0') {
      ssl->keep_current_message = 1;
    }
    else {
      uVar25 = ssl->in_hslen;
      lVar30 = (ulong)(ssl->conf->transport == '\x01') * 8;
      uVar36 = lVar30 + 4;
      if (uVar25 <= uVar36) {
        pcVar28 = "bad certificate request message";
        iVar15 = 0xa02;
        goto LAB_001d1e3b;
      }
      puVar24 = ssl->in_msg;
      uVar27 = (ulong)puVar24[uVar36];
      if (uVar25 <= uVar27 + uVar36 + 2) {
        pcVar28 = "bad certificate request message";
        iVar15 = 0xa15;
        goto LAB_001d1e3b;
      }
      uVar32 = (ulong)(ushort)(*(ushort *)(puVar24 + uVar27 + lVar30 + 5) << 8 |
                              *(ushort *)(puVar24 + uVar27 + lVar30 + 5) >> 8);
      lVar30 = uVar36 + uVar27;
      if (uVar25 <= lVar30 + uVar32 + 3) {
        pcVar28 = "bad certificate request message";
        iVar15 = 0xa2c;
        goto LAB_001d1e3b;
      }
      hashlen = uVar27;
      local_38 = puVar24;
      for (uVar36 = 0; uVar36 < uVar32; uVar36 = uVar36 + 2) {
        in_stack_fffffffffffffe38 =
             CONCAT44((int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                      (uint)puVar24[uVar36 + lVar30 + 4]);
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,0xa39,"Supported Signature Algorithm found: %02x %02x",
                   (ulong)puVar24[uVar36 + lVar30 + 3],in_stack_fffffffffffffe38);
      }
      lVar30 = hashlen + uVar32 + 2;
      uVar36 = (ulong)(ssl->conf->transport == '\x01');
      uVar25 = (ulong)(ushort)(*(ushort *)(local_38 + lVar30 + uVar36 * 8 + 5) << 8 |
                              *(ushort *)(local_38 + lVar30 + uVar36 * 8 + 5) >> 8);
      if (ssl->in_hslen != hashlen + uVar32 + uVar36 * 8 + uVar25 + 9) {
        pcVar28 = "bad certificate request message";
        iVar15 = 0xa45;
        goto LAB_001d1e3b;
      }
      local_38 = local_38 + lVar30 + uVar36 * 8 + 7;
      hashlen = uVar25 - 2;
      for (uVar36 = 0; uVar36 < uVar25; uVar36 = uVar36 + uVar27 + 2) {
        local_48 = (ushort *)((long)(local_38 + uVar36) + 2);
        _uStack_98 = (ushort *)0x0;
        n = 0;
        local_88 = (uchar *)0x0;
        iStack_80 = 0;
        uStack_7c = 0;
        local_78 = 0;
        puStack_70 = (uchar *)0x0;
        local_68 = (mbedtls_asn1_named_data *)0x0;
        uStack_60 = '\0';
        uStack_5f = 0;
        uVar13 = *(ushort *)(local_38 + uVar36);
        uVar27 = (ulong)(ushort)(uVar13 << 8 | uVar13 >> 8);
        if (((hashlen - uVar36 < uVar27) ||
            (iVar15 = mbedtls_asn1_get_tag
                                ((uchar **)&local_48,(uchar *)((long)local_48 + uVar27),&local_a8,
                                 0x30), iVar15 != 0)) ||
           (iVar15 = mbedtls_x509_get_name
                               ((uchar **)&local_48,(uchar *)((long)local_48 + local_a8),
                                (mbedtls_x509_name *)&stack0xffffffffffffff68), iVar15 != 0)) {
          pcVar28 = "bad certificate request message";
          iVar15 = 0xa58;
          goto LAB_001d1e3b;
        }
        uVar17 = mbedtls_x509_dn_gets
                           ((char *)&local_1a8,0x100,(mbedtls_x509_name *)&stack0xffffffffffffff68);
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,0xa61,"DN hint: %.*s",(ulong)uVar17,&local_1a8);
        mbedtls_asn1_free_named_data_list_shallow(local_68);
      }
    }
    pcVar28 = "<= parse certificate request";
    iVar33 = 0;
    iVar15 = 2;
    iVar23 = 0xa67;
    break;
  case 6:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0xa72,"=> parse server hello done");
    iVar15 = mbedtls_ssl_read_record(ssl,1);
    if (iVar15 != 0) {
      pcVar28 = "mbedtls_ssl_read_record";
      iVar23 = 0xa75;
      goto LAB_001d2789;
    }
    if (ssl->in_msgtype != 0x16) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0xa7a,"bad server hello done message");
      return -0x7700;
    }
    uVar29 = ssl->conf->transport;
    if ((ssl->in_hslen != (ulong)(uVar29 == '\x01') * 8 + 4) || (*ssl->in_msg != '\x0e')) {
      pcVar28 = "bad server hello done message";
      iVar15 = 0xa80;
      goto LAB_001d1e3b;
    }
    ssl->state = ssl->state + 1;
    if (uVar29 == '\x01') {
      mbedtls_ssl_recv_flight_completed(ssl);
    }
    pcVar28 = "<= parse server hello done";
    iVar33 = 0;
    iVar15 = 2;
    iVar23 = 0xa8e;
    break;
  case 7:
    iVar15 = mbedtls_ssl_write_certificate(ssl);
    return iVar15;
  case 8:
    lVar30 = 4;
    pmVar21 = ssl->handshake->ciphersuite_info;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0xa9d,"=> write client key exchange");
    if ((pmVar21->key_exchange < 0xb) && ((0x618U >> (pmVar21->key_exchange & 0x1f) & 1) != 0)) {
      iVar15 = mbedtls_ecdh_make_public
                         (&ssl->handshake->ecdh_ctx,&local_1a8,ssl->out_msg + 4,1000,
                          (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng);
      if (iVar15 != 0) {
        pcVar28 = "mbedtls_ecdh_make_public";
        iVar23 = 0xb26;
        goto LAB_001d2789;
      }
      mbedtls_debug_printf_ecdh
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0xb30,&ssl->handshake->ecdh_ctx,MBEDTLS_DEBUG_ECDH_Q);
      pmVar4 = ssl->handshake;
      iVar15 = mbedtls_ecdh_calc_secret
                         (&pmVar4->ecdh_ctx,&pmVar4->pmslen,pmVar4->premaster,0x20,
                          (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng);
      if (iVar15 != 0) {
        pcVar28 = "mbedtls_ecdh_calc_secret";
        iVar23 = 0xb42;
        goto LAB_001d2789;
      }
      mbedtls_debug_printf_ecdh
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0xb4c,&ssl->handshake->ecdh_ctx,MBEDTLS_DEBUG_ECDH_Z);
    }
    else {
      iVar15 = mbedtls_ssl_ciphersuite_uses_psk(pmVar21);
      if (iVar15 == 0) {
        if (pmVar21->key_exchange != '\v') {
          iVar15 = 0xc7d;
          goto LAB_001d1f2b;
        }
        iVar15 = mbedtls_ecjpake_write_round_two
                           (&ssl->handshake->ecjpake_ctx,ssl->out_msg + 4,0x3fc,&local_1a8,
                            (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng
                           );
        if (iVar15 != 0) {
          pcVar28 = "mbedtls_ecjpake_write_round_two";
          iVar23 = 0xc6d;
          goto LAB_001d2789;
        }
        pmVar4 = ssl->handshake;
        iVar15 = mbedtls_ecjpake_derive_secret
                           (&pmVar4->ecjpake_ctx,pmVar4->premaster,0x20,&pmVar4->pmslen,
                            (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng
                           );
        if (iVar15 != 0) {
          pcVar28 = "mbedtls_ecjpake_derive_secret";
          iVar23 = 0xc75;
          goto LAB_001d2789;
        }
      }
      else {
        iVar15 = mbedtls_ssl_conf_has_static_psk(ssl->conf);
        iVar33 = -0x6c00;
        if (iVar15 == 0) {
          return -0x6c00;
        }
        local_1a8 = ssl->conf->psk_identity_len;
        if (local_1a8 - 0x3fb < 0xfffffffffffffbff) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0xbe2,"psk identity too long or SSL buffer too short");
          return -0x6a00;
        }
        ssl->out_msg[4] = (uchar)(local_1a8 >> 8);
        ssl->out_msg[5] = (uchar)local_1a8;
        memcpy(ssl->out_msg + 6,ssl->conf->psk_identity,ssl->conf->psk_identity_len);
        if (pmVar21->key_exchange != '\x05') {
          pcVar28 = "should never happen";
          iVar15 = 1;
          iVar23 = 0xc3d;
          break;
        }
        sVar31 = ssl->conf->psk_identity_len;
        local_1a8 = 0;
        iVar15 = mbedtls_ssl_psk_derive_premaster(ssl,MBEDTLS_KEY_EXCHANGE_PSK);
        if (iVar15 != 0) {
          pcVar28 = "mbedtls_ssl_psk_derive_premaster";
          iVar23 = 0xc46;
          goto LAB_001d2789;
        }
        lVar30 = sVar31 + 6;
      }
    }
    ssl->out_msglen = lVar30 + local_1a8;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\x10';
    ssl->state = ssl->state + 1;
    iVar15 = mbedtls_ssl_write_handshake_msg(ssl);
    if (iVar15 != 0) {
      pcVar28 = "mbedtls_ssl_write_handshake_msg";
      iVar23 = 0xc88;
      goto LAB_001d2789;
    }
    pcVar28 = "<= write client key exchange";
    iVar33 = 0;
    iVar15 = 2;
    iVar23 = 0xc8c;
    break;
  case 9:
    pmVar21 = ssl->handshake->ciphersuite_info;
    _uStack_98 = (ushort *)0x0;
    puVar24 = ssl->out_buf;
    puVar20 = ssl->out_msg;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0xcbc,"=> write certificate verify");
    iVar15 = mbedtls_ssl_derive_keys(ssl);
    if (iVar15 == 0) {
      uVar17 = (uint)pmVar21->key_exchange;
      if ((uVar17 < 0xb) && ((0x61eU >> (uVar17 & 0x1f) & 1) != 0)) {
        pmVar4 = ssl->handshake;
        if ((pmVar4->client_auth != '\0') &&
           (((pmVar18 = pmVar4->key_cert, pmVar18 != (mbedtls_ssl_key_cert *)0x0 ||
             (pmVar18 = ssl->conf->key_cert, pmVar18 != (mbedtls_ssl_key_cert *)0x0)) &&
            (pmVar18->cert != (mbedtls_x509_crt *)0x0)))) {
          pmVar19 = mbedtls_ssl_own_key(ssl);
          if (pmVar19 == (mbedtls_pk_context *)0x0) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                       ,0xcd8,"got no private key for certificate");
            return -0x7600;
          }
          iVar15 = (*pmVar4->calc_verify)(ssl,(uchar *)&local_1a8,(size_t *)&local_48);
          if (iVar15 == 0) {
            bVar37 = ssl->handshake->ciphersuite_info->mac == '\n';
            ssl->out_msg[4] = bVar37 | 4;
            pmVar19 = mbedtls_ssl_own_key(ssl);
            uVar11 = mbedtls_ssl_sig_from_pk(pmVar19);
            ssl->out_msg[5] = uVar11;
            local_48 = (ushort *)0x0;
            pmVar19 = mbedtls_ssl_own_key(ssl);
            iVar15 = mbedtls_pk_sign_restartable
                               (pmVar19,bVar37 + MBEDTLS_MD_SHA256,(uchar *)&local_1a8,0,
                                ssl->out_msg + 8,(size_t)(puVar24 + (0x425 - (long)puVar20)),
                                (size_t *)&stack0xffffffffffffff68,
                                (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,
                                ssl->conf->p_rng,(mbedtls_pk_restart_ctx *)0x0);
            if (iVar15 == 0) {
              *(ushort *)(ssl->out_msg + 6) = uStack_98 << 8 | uStack_98 >> 8;
              ssl->out_msglen = (size_t)(_uStack_98 + 4);
              ssl->out_msgtype = 0x16;
              *ssl->out_msg = '\x0f';
              ssl->state = ssl->state + 1;
              iVar15 = mbedtls_ssl_write_handshake_msg(ssl);
              if (iVar15 == 0) {
                pcVar28 = "<= write certificate verify";
                iVar33 = 0;
                iVar15 = 2;
                iVar23 = 0xd2c;
                break;
              }
              pcVar28 = "mbedtls_ssl_write_handshake_msg";
              iVar23 = 0xd28;
            }
            else {
              pcVar28 = "mbedtls_pk_sign";
              iVar23 = 0xd16;
            }
          }
          else {
            pcVar28 = "calc_verify";
            iVar23 = 0xce9;
          }
          goto LAB_001d2789;
        }
        pcVar28 = "<= skip write certificate verify";
        iVar15 = 0xcd2;
      }
      else {
        pcVar28 = "<= skip write certificate verify";
        iVar15 = 0xccb;
      }
LAB_001d1cec:
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,iVar15,pcVar28);
      ssl->state = ssl->state + 1;
      return 0;
    }
    pcVar28 = "mbedtls_ssl_derive_keys";
    iVar23 = 0xcc6;
    goto LAB_001d2789;
  case 10:
    iVar15 = mbedtls_ssl_write_change_cipher_spec(ssl);
    return iVar15;
  case 0xb:
    iVar15 = mbedtls_ssl_write_finished(ssl);
    return iVar15;
  case 0xc:
    iVar15 = mbedtls_ssl_parse_change_cipher_spec(ssl);
    return iVar15;
  case 0xd:
    iVar15 = mbedtls_ssl_parse_finished(ssl);
    return iVar15;
  case 0xe:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0xe07,"handshake: done");
    ssl->state = 0xf;
    return 0;
  case 0xf:
    mbedtls_ssl_handshake_wrapup(ssl);
    return 0;
  default:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0xe10,"invalid state %d");
    return -0x7100;
  }
  mbedtls_debug_print_msg
            (ssl,iVar15,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
             ,iVar23,pcVar28);
  return iVar33;
}

Assistant:

int mbedtls_ssl_handshake_client_step(mbedtls_ssl_context *ssl)
{
    int ret = 0;

    /* Change state now, so that it is right in mbedtls_ssl_read_record(), used
     * by DTLS for dropping out-of-sequence ChangeCipherSpec records */
#if defined(MBEDTLS_SSL_SESSION_TICKETS)
    if (ssl->state == MBEDTLS_SSL_SERVER_CHANGE_CIPHER_SPEC &&
        ssl->handshake->new_session_ticket != 0) {
        ssl->state = MBEDTLS_SSL_NEW_SESSION_TICKET;
    }
#endif

    switch (ssl->state) {
        case MBEDTLS_SSL_HELLO_REQUEST:
            ssl->state = MBEDTLS_SSL_CLIENT_HELLO;
            break;

        /*
         *  ==>   ClientHello
         */
        case MBEDTLS_SSL_CLIENT_HELLO:
            ret = mbedtls_ssl_write_client_hello(ssl);
            break;

        /*
         *  <==   ServerHello
         *        Certificate
         *      ( ServerKeyExchange  )
         *      ( CertificateRequest )
         *        ServerHelloDone
         */
        case MBEDTLS_SSL_SERVER_HELLO:
            ret = ssl_parse_server_hello(ssl);
            break;

        case MBEDTLS_SSL_SERVER_CERTIFICATE:
            ret = mbedtls_ssl_parse_certificate(ssl);
            break;

        case MBEDTLS_SSL_SERVER_KEY_EXCHANGE:
            ret = ssl_parse_server_key_exchange(ssl);
            break;

        case MBEDTLS_SSL_CERTIFICATE_REQUEST:
            ret = ssl_parse_certificate_request(ssl);
            break;

        case MBEDTLS_SSL_SERVER_HELLO_DONE:
            ret = ssl_parse_server_hello_done(ssl);
            break;

        /*
         *  ==> ( Certificate/Alert  )
         *        ClientKeyExchange
         *      ( CertificateVerify  )
         *        ChangeCipherSpec
         *        Finished
         */
        case MBEDTLS_SSL_CLIENT_CERTIFICATE:
            ret = mbedtls_ssl_write_certificate(ssl);
            break;

        case MBEDTLS_SSL_CLIENT_KEY_EXCHANGE:
            ret = ssl_write_client_key_exchange(ssl);
            break;

        case MBEDTLS_SSL_CERTIFICATE_VERIFY:
            ret = ssl_write_certificate_verify(ssl);
            break;

        case MBEDTLS_SSL_CLIENT_CHANGE_CIPHER_SPEC:
            ret = mbedtls_ssl_write_change_cipher_spec(ssl);
            break;

        case MBEDTLS_SSL_CLIENT_FINISHED:
            ret = mbedtls_ssl_write_finished(ssl);
            break;

            /*
             *  <==   ( NewSessionTicket )
             *        ChangeCipherSpec
             *        Finished
             */
#if defined(MBEDTLS_SSL_SESSION_TICKETS)
        case MBEDTLS_SSL_NEW_SESSION_TICKET:
            ret = ssl_parse_new_session_ticket(ssl);
            break;
#endif

        case MBEDTLS_SSL_SERVER_CHANGE_CIPHER_SPEC:
            ret = mbedtls_ssl_parse_change_cipher_spec(ssl);
            break;

        case MBEDTLS_SSL_SERVER_FINISHED:
            ret = mbedtls_ssl_parse_finished(ssl);
            break;

        case MBEDTLS_SSL_FLUSH_BUFFERS:
            MBEDTLS_SSL_DEBUG_MSG(2, ("handshake: done"));
            ssl->state = MBEDTLS_SSL_HANDSHAKE_WRAPUP;
            break;

        case MBEDTLS_SSL_HANDSHAKE_WRAPUP:
            mbedtls_ssl_handshake_wrapup(ssl);
            break;

        default:
            MBEDTLS_SSL_DEBUG_MSG(1, ("invalid state %d", ssl->state));
            return MBEDTLS_ERR_SSL_BAD_INPUT_DATA;
    }

    return ret;
}